

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool mz_zip_reader_extract_to_file
                  (mz_zip_archive *pZip,mz_uint file_index,char *pDst_filename,mz_uint flags)

{
  mz_bool mVar1;
  int iVar2;
  FILE *__stream;
  mz_bool mVar3;
  mz_bool mVar4;
  mz_zip_archive_file_stat file_stat;
  utimbuf local_288;
  mz_zip_archive_file_stat local_278;
  
  mVar1 = mz_zip_reader_file_stat(pZip,file_index,&local_278);
  mVar3 = 0;
  mVar4 = 0;
  if (mVar1 != 0) {
    __stream = fopen64(pDst_filename,"wb");
    mVar4 = mVar3;
    if (__stream != (FILE *)0x0) {
      mVar1 = mz_zip_reader_extract_to_callback
                        (pZip,file_index,(anonymous_namespace)::miniz::mz_zip_file_write_callback,
                         __stream,flags);
      iVar2 = fclose(__stream);
      if ((iVar2 != -1) && (mVar1 != 0)) {
        local_288.actime = local_278.m_time;
        local_288.modtime = local_278.m_time;
        utime(pDst_filename,&local_288);
        mVar4 = 1;
      }
    }
  }
  return mVar4;
}

Assistant:

mz_bool mz_zip_reader_extract_to_file(mz_zip_archive *pZip, mz_uint file_index,
                                      const char *pDst_filename,
                                      mz_uint flags) {
  mz_bool status;
  mz_zip_archive_file_stat file_stat;
  MZ_FILE *pFile;
  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;
  pFile = MZ_FOPEN(pDst_filename, "wb");
  if (!pFile)
    return MZ_FALSE;
  status = mz_zip_reader_extract_to_callback(
      pZip, file_index, mz_zip_file_write_callback, pFile, flags);
  if (MZ_FCLOSE(pFile) == EOF)
    return MZ_FALSE;
#ifndef MINIZ_NO_TIME
  if (status)
    mz_zip_set_file_times(pDst_filename, file_stat.m_time, file_stat.m_time);
#endif
  return status;
}